

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversePowerSeries.hpp
# Opt level: O2

string * __thiscall
OpenMD::InversePowerSeries::getName_abi_cxx11_
          (string *__return_storage_ptr__,InversePowerSeries *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name_);
  return __return_storage_ptr__;
}

Assistant:

virtual string getName() { return name_; }